

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pmx.cpp
# Opt level: O2

void __thiscall pmx::PmxFrame::Read(PmxFrame *this,istream *stream,PmxSetting *setting)

{
  _Alloc_hider __p;
  uint8_t in_CL;
  int i;
  long lVar1;
  long lVar2;
  string local_50;
  
  ReadString_abi_cxx11_(&local_50,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  ReadString_abi_cxx11_(&local_50,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)&this->frame_english_name,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::istream::read((char *)stream,(long)&this->frame_flag);
  std::istream::read((char *)stream,(long)&this->element_count);
  std::make_unique<pmx::PmxFrameElement[]>((size_t)&local_50);
  __p._M_p = local_50._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<pmx::PmxFrameElement,_std::default_delete<pmx::PmxFrameElement[]>_>::reset
            ((__uniq_ptr_impl<pmx::PmxFrameElement,_std::default_delete<pmx::PmxFrameElement[]>_> *)
             &this->elements,(pointer)__p._M_p);
  std::unique_ptr<pmx::PmxFrameElement[],_std::default_delete<pmx::PmxFrameElement[]>_>::~unique_ptr
            ((unique_ptr<pmx::PmxFrameElement[],_std::default_delete<pmx::PmxFrameElement[]>_> *)
             &local_50);
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < this->element_count; lVar1 = lVar1 + 1) {
    PmxFrameElement::Read
              ((PmxFrameElement *)
               (&((this->elements)._M_t.
                  super___uniq_ptr_impl<pmx::PmxFrameElement,_std::default_delete<pmx::PmxFrameElement[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_pmx::PmxFrameElement_*,_std::default_delete<pmx::PmxFrameElement[]>_>
                  .super__Head_base<0UL,_pmx::PmxFrameElement_*,_false>._M_head_impl)->
                 element_target + lVar2),stream,setting);
    lVar2 = lVar2 + 8;
  }
  return;
}

Assistant:

void PmxFrame::Read(std::istream *stream, PmxSetting *setting)
	{
		this->frame_name = ReadString(stream, setting->encoding);
		this->frame_english_name = ReadString(stream, setting->encoding);
		stream->read((char*) &this->frame_flag, sizeof(uint8_t));
		stream->read((char*) &this->element_count, sizeof(int));
		this->elements = std::make_unique<PmxFrameElement []>(this->element_count);
		for (int i = 0; i < this->element_count; i++)
		{
			this->elements[i].Read(stream, setting);
		}
	}